

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ArrayFeatureType::set_allocated_shaperange
          (ArrayFeatureType *this,ArrayFeatureType_ShapeRange *shaperange)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_ShapeFlexibility(this);
  if (shaperange != (ArrayFeatureType_ShapeRange *)0x0) {
    uVar1 = (shaperange->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 2) == 0) {
      submessage_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        submessage_arena = *(Arena **)submessage_arena;
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      shaperange = (ArrayFeatureType_ShapeRange *)
                   google::protobuf::internal::GetOwnedMessageInternal
                             (message_arena,&shaperange->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x1f;
    (this->ShapeFlexibility_).shaperange_ = shaperange;
  }
  return;
}

Assistant:

void ArrayFeatureType::set_allocated_shaperange(::CoreML::Specification::ArrayFeatureType_ShapeRange* shaperange) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_ShapeFlexibility();
  if (shaperange) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::ArrayFeatureType_ShapeRange>::GetOwningArena(shaperange);
    if (message_arena != submessage_arena) {
      shaperange = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, shaperange, submessage_arena);
    }
    set_has_shaperange();
    ShapeFlexibility_.shaperange_ = shaperange;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.ArrayFeatureType.shapeRange)
}